

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl)

{
  uint uVar1;
  Fts5Data *pFVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  i64 iVal;
  u64 local_20;
  
  pFVar2 = pLvl->pData;
  uVar1 = pLvl->iOff;
  lVar6 = (long)(int)uVar1;
  if (lVar6 == 0) {
    pLvl->iOff = 1;
    iVar5 = sqlite3Fts5GetVarint32(pFVar2->p + 1,(u32 *)&pLvl->iLeafPgno);
    lVar6 = (long)iVar5 + (long)pLvl->iOff;
    pLvl->iOff = (int)lVar6;
    bVar4 = sqlite3Fts5GetVarint(pFVar2->p + lVar6,(u64 *)&pLvl->iRowid);
    iVar5 = (uint)bVar4 + pLvl->iOff;
    pLvl->iOff = iVar5;
    pLvl->iFirstOff = iVar5;
  }
  else {
    iVar5 = pFVar2->nn;
    bVar9 = (int)uVar1 < iVar5;
    if ((int)uVar1 < iVar5) {
      if (pFVar2->p[lVar6] == '\0') {
        iVar7 = ~uVar1 + iVar5;
        lVar8 = lVar6;
        do {
          bVar9 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          if (bVar9) goto LAB_001ccb6a;
          lVar6 = lVar8 + 1;
          lVar3 = lVar8 + 1;
          lVar8 = lVar6;
        } while (pFVar2->p[lVar3] == '\0');
        bVar9 = lVar6 < iVar5;
      }
      if (bVar9) {
        iVar5 = (int)lVar6;
        pLvl->iLeafPgno = (iVar5 - uVar1) + pLvl->iLeafPgno + 1;
        bVar4 = sqlite3Fts5GetVarint(pFVar2->p + iVar5,&local_20);
        pLvl->iRowid = pLvl->iRowid + local_20;
        pLvl->iOff = iVar5 + (uint)bVar4;
        goto LAB_001ccbae;
      }
    }
LAB_001ccb6a:
    pLvl->bEof = 1;
  }
LAB_001ccbae:
  return pLvl->bEof;
}

Assistant:

static int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl){
  Fts5Data *pData = pLvl->pData;

  if( pLvl->iOff==0 ){
    assert( pLvl->bEof==0 );
    pLvl->iOff = 1;
    pLvl->iOff += fts5GetVarint32(&pData->p[1], pLvl->iLeafPgno);
    pLvl->iOff += fts5GetVarint(&pData->p[pLvl->iOff], (u64*)&pLvl->iRowid);
    pLvl->iFirstOff = pLvl->iOff;
  }else{
    int iOff;
    for(iOff=pLvl->iOff; iOff<pData->nn; iOff++){
      if( pData->p[iOff] ) break; 
    }

    if( iOff<pData->nn ){
      i64 iVal;
      pLvl->iLeafPgno += (iOff - pLvl->iOff) + 1;
      iOff += fts5GetVarint(&pData->p[iOff], (u64*)&iVal);
      pLvl->iRowid += iVal;
      pLvl->iOff = iOff;
    }else{
      pLvl->bEof = 1;
    }
  }

  return pLvl->bEof;
}